

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O3

void vkt::sr::anon_unknown_0::MatrixCaseUtils::Evaluator<3,_8,_1>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  bool bVar1;
  long lVar2;
  float *pfVar3;
  float *pfVar4;
  int col;
  long lVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  long lVar9;
  bool bVar10;
  undefined1 auVar11 [16];
  float fVar12;
  float fVar13;
  float local_68 [8];
  Type in0;
  float afStack_30 [2];
  undefined8 local_28;
  float local_20;
  int aiStack_18 [6];
  
  pfVar4 = in0.m_data.m_data[0].m_data + 1;
  if (in0Type == INPUTTYPE_DYNAMIC) {
    lVar2 = 0;
    pfVar3 = (float *)&in0;
    bVar10 = true;
    do {
      bVar1 = bVar10;
      lVar5 = 0;
      auVar8 = _DAT_00a99400;
      do {
        bVar10 = SUB164(auVar8 ^ _DAT_00a99450,4) == -0x80000000 &&
                 SUB164(auVar8 ^ _DAT_00a99450,0) < -0x7ffffffd;
        if (bVar10) {
          fVar12 = 1.0;
          if (lVar2 != lVar5) {
            fVar12 = 0.0;
          }
          pfVar3[lVar5 * 2] = fVar12;
        }
        if (bVar10) {
          fVar12 = 1.0;
          if (lVar2 + -1 != lVar5) {
            fVar12 = 0.0;
          }
          pfVar3[lVar5 * 2 + 2] = fVar12;
        }
        lVar5 = lVar5 + 2;
        lVar9 = auVar8._8_8_;
        auVar8._0_8_ = auVar8._0_8_ + 2;
        auVar8._8_8_ = lVar9 + 2;
      } while (lVar5 != 4);
      lVar2 = 1;
      pfVar3 = pfVar4;
      bVar10 = false;
    } while (bVar1);
    in0.m_data.m_data[0].m_data = *(float (*) [2])evalCtx->in[0].m_data;
    in0.m_data.m_data[1].m_data = *(float (*) [2])evalCtx->in[1].m_data;
    in0.m_data.m_data[2].m_data = *(float (*) [2])evalCtx->in[2].m_data;
  }
  else {
    in0.m_data.m_data[0].m_data[0] = 0.0;
    in0.m_data.m_data[0].m_data[1] = 0.0;
    in0.m_data.m_data[1].m_data[0] = 0.0;
    in0.m_data.m_data[1].m_data[1] = 0.0;
    in0.m_data.m_data[2].m_data[0] = 0.0;
    in0.m_data.m_data[2].m_data[1] = 0.0;
    lVar2 = 0;
    pfVar3 = (float *)&in0;
    bVar10 = true;
    do {
      bVar1 = bVar10;
      lVar5 = 0;
      do {
        pfVar3[lVar5 * 2] =
             *(float *)((long)&sr::(anonymous_namespace)::s_constInMat3x2 + lVar2 + lVar5 * 4);
        lVar5 = lVar5 + 1;
      } while (lVar5 != 3);
      lVar2 = 0xc;
      pfVar3 = pfVar4;
      bVar10 = false;
    } while (bVar1);
  }
  fVar12 = (evalCtx->coords).m_data[0];
  local_68[0] = 0.0;
  local_68[1] = 0.0;
  local_68[2] = 0.0;
  local_68[3] = 0.0;
  local_68[4] = 0.0;
  local_68[5] = 0.0;
  lVar2 = 0;
  pfVar4 = local_68;
  bVar10 = true;
  do {
    bVar1 = bVar10;
    lVar5 = 0;
    auVar11 = _DAT_00a99400;
    do {
      bVar10 = SUB164(auVar11 ^ _DAT_00a99450,4) == -0x80000000 &&
               SUB164(auVar11 ^ _DAT_00a99450,0) < -0x7ffffffd;
      if (bVar10) {
        fVar13 = 1.0;
        if (lVar2 != lVar5) {
          fVar13 = 0.0;
        }
        pfVar4[lVar5 * 2] = fVar13;
      }
      if (bVar10) {
        fVar13 = 1.0;
        if (lVar2 + -1 != lVar5) {
          fVar13 = 0.0;
        }
        pfVar4[(lVar5 + 1) * 2] = fVar13;
      }
      lVar5 = lVar5 + 2;
      lVar9 = auVar11._8_8_;
      auVar11._0_8_ = auVar11._0_8_ + 2;
      auVar11._8_8_ = lVar9 + 2;
    } while (lVar5 != 4);
    lVar2 = 1;
    pfVar4 = local_68 + 1;
    bVar10 = false;
  } while (bVar1);
  if (in1Type != INPUTTYPE_DYNAMIC) {
    fVar12 = -0.2;
  }
  auVar6._4_4_ = fVar12;
  auVar6._0_4_ = fVar12;
  auVar6._8_4_ = fVar12;
  auVar6._12_4_ = fVar12;
  lVar2 = 0;
  do {
    auVar7._8_8_ = 0;
    auVar7._0_8_ = *(ulong *)in0.m_data.m_data[lVar2].m_data;
    auVar8 = divps(auVar7,auVar6);
    *(long *)(local_68 + lVar2 * 2) = auVar8._0_8_;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  local_28 = CONCAT44(local_68[3] + local_68[2],local_68[0] + local_68[1]);
  local_20 = local_68[4] + local_68[5];
  aiStack_18[2] = 0;
  aiStack_18[3] = 1;
  aiStack_18[4] = 2;
  lVar2 = 2;
  do {
    (evalCtx->color).m_data[aiStack_18[lVar2]] = afStack_30[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(in0 / in1);
	}